

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)

{
  ImGuiWindow *window;
  ImGuiWindow *window_00;
  bool bVar1;
  
  window = GImGui->NavWindow;
  if (window == (ImGuiWindow *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if ((flags & 4U) == 0) {
      window_00 = GImGui->CurrentWindow;
      if ((flags & 2U) != 0) {
        window_00 = GetCombinedRootWindow(window_00,(flags & 8U) == 0);
      }
      if ((flags & 1U) != 0) {
        bVar1 = IsWindowChildOf(window,window_00,(flags & 8U) == 0);
        return bVar1;
      }
      bVar1 = window == window_00;
    }
  }
  return bVar1;
}

Assistant:

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* ref_window = g.NavWindow;
    ImGuiWindow* cur_window = g.CurrentWindow;

    if (ref_window == NULL)
        return false;
    if (flags & ImGuiFocusedFlags_AnyWindow)
        return true;

    IM_ASSERT(cur_window); // Not inside a Begin()/End()
    const bool popup_hierarchy = (flags & ImGuiFocusedFlags_NoPopupHierarchy) == 0;
    if (flags & ImGuiHoveredFlags_RootWindow)
        cur_window = GetCombinedRootWindow(cur_window, popup_hierarchy);

    if (flags & ImGuiHoveredFlags_ChildWindows)
        return IsWindowChildOf(ref_window, cur_window, popup_hierarchy);
    else
        return (ref_window == cur_window);
}